

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

void ImGui::SFML::Update(Window *window,RenderTarget *target,Time dt)

{
  bool bVar1;
  int iVar2;
  ImGuiMouseCursor IVar3;
  uint uVar4;
  ImGuiIO *pIVar5;
  undefined4 extraout_var;
  Vector2i VVar7;
  undefined4 extraout_var_00;
  Vector2f *displaySize;
  Vector2f *mousePos;
  Vector2f local_38;
  Vector2f local_30;
  ulong uVar6;
  long lVar8;
  
  SetCurrentWindow(window);
  if ((anonymous_namespace)::s_currWindowCtx == 0) {
    __assert_fail("s_currWindowCtx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x1af,"void ImGui::SFML::Update(sf::Window &, sf::RenderTarget &, sf::Time)");
  }
  pIVar5 = GetIO();
  if (pIVar5->MouseDrawCursor == false) {
    iVar2 = GetMouseCursor();
  }
  else {
    iVar2 = -1;
  }
  if (*(int *)((anonymous_namespace)::s_currWindowCtx + 0x40) != iVar2) {
    *(int *)((anonymous_namespace)::s_currWindowCtx + 0x40) = iVar2;
    pIVar5 = GetIO();
    if ((pIVar5->ConfigFlags & 0x20) == 0) {
      IVar3 = GetMouseCursor();
      if ((IVar3 == -1) || (pIVar5->MouseDrawCursor != false)) {
        sf::Window::setMouseCursorVisible(window,false);
      }
      else {
        sf::Window::setMouseCursorVisible(window,true);
        lVar8 = (anonymous_namespace)::s_currWindowCtx + (long)IVar3 * 8;
        if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0x110 + (long)IVar3) == '\0') {
          lVar8 = (anonymous_namespace)::s_currWindowCtx;
        }
        sf::Window::setMouseCursor(window,(Cursor *)(lVar8 + 200));
      }
    }
  }
  displaySize = &local_38;
  mousePos = &local_38;
  if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0x39) == '\0') {
    bVar1 = sf::Touch::isDown(0);
    lVar8 = (anonymous_namespace)::s_currWindowCtx;
    if (bVar1) {
      VVar7 = sf::Touch::getPosition(0,window);
      lVar8 = (anonymous_namespace)::s_currWindowCtx;
      *(Vector2i *)((anonymous_namespace)::s_currWindowCtx + 0x48) = VVar7;
    }
    mousePos = (Vector2f *)(lVar8 + 0x48);
    uVar4 = (*target->_vptr_RenderTarget[2])(target);
    uVar6 = CONCAT44(extraout_var_00,uVar4);
  }
  else {
    local_38 = (Vector2f)sf::Mouse::getPosition(window);
    uVar4 = (*target->_vptr_RenderTarget[2])(target);
    uVar6 = CONCAT44(extraout_var,uVar4);
    displaySize = &local_30;
  }
  displaySize->x = (float)uVar4;
  displaySize->y = (float)(uVar6 >> 0x20);
  Update((Vector2i *)mousePos,displaySize,dt);
  return;
}

Assistant:

void Update(sf::Window& window, sf::RenderTarget& target, sf::Time dt) {
    SetCurrentWindow(window);
    assert(s_currWindowCtx);

    // Update OS/hardware mouse cursor if imgui isn't drawing a software cursor
    ImGuiMouseCursor mouse_cursor =
        ImGui::GetIO().MouseDrawCursor ? ImGuiMouseCursor_None : ImGui::GetMouseCursor();
    if (s_currWindowCtx->lastCursor != mouse_cursor) {
        s_currWindowCtx->lastCursor = mouse_cursor;
        updateMouseCursor(window);
    }

    if (!s_currWindowCtx->mouseMoved) {
        if (sf::Touch::isDown(0)) s_currWindowCtx->touchPos = sf::Touch::getPosition(0, window);

        Update(s_currWindowCtx->touchPos, static_cast<sf::Vector2f>(target.getSize()), dt);
    } else {
        Update(sf::Mouse::getPosition(window), static_cast<sf::Vector2f>(target.getSize()), dt);
    }
}